

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * Catch::toString(string *__return_storage_ptr__,wstring *value)

{
  size_t i;
  ulong uVar1;
  string s;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&s);
  for (uVar1 = 0; uVar1 < value->_M_string_length; uVar1 = uVar1 + 1) {
    std::__cxx11::string::push_back((char)&s);
  }
  toString(__return_storage_ptr__,&s);
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

inline void deleteAll( ContainerT& container ) {
        typename ContainerT::const_iterator it = container.begin();
        typename ContainerT::const_iterator itEnd = container.end();
        for(; it != itEnd; ++it )
            delete *it;
    }